

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

void __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreUniformLimitsTest::testGeometryShaderStage
          (ImageLoadStoreUniformLimitsTest *this)

{
  bool bVar1;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar2;
  int local_1a0 [4];
  MessageBuilder local_190;
  ImageLoadStoreUniformLimitsTest *local_10;
  ImageLoadStoreUniformLimitsTest *this_local;
  
  local_10 = this;
  bVar1 = doesProgramLink(this,
                          "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nvoid main()\n{\n    discard;\n}\n\n"
                          ,
                          "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nlayout(points)                   in;\nlayout(points, max_vertices = 1) out;\n\n#define N_UNIFORMS gl_MaxGeometryImageUniforms + 1\n\nin ivec2 vs_gs_coord[];\n\nlayout(r32i) uniform iimage2D u_image[N_UNIFORMS];\n\nvoid main()\n{\n    int value = 1;\n\n    for (int i = 0; i < N_UNIFORMS; ++i)\n    {\n        value = imageAtomicAdd(u_image[i], vs_gs_coord[0], value);\n    }\n}\n\n"
                          ,(char *)0x0,(char *)0x0,
                          "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nin  ivec2 vs_in_coord;\nout ivec2 vs_gs_coord;\n\nvoid main()\n{\n    vs_gs_coord = vs_in_coord;\n}\n\n"
                         );
  this->m_result_for_geometry_shader = (bool)((bVar1 ^ 0xffU) & 1);
  if ((this->m_result_for_geometry_shader & 1U) == 0) {
    this_00 = deqp::Context::getTestContext
                        ((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                         m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_190,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<
                       (&local_190,
                        (char (*) [87])
                        "Program which exceeds limit of GL_MAX_GEOMETRY_IMAGE_UNIFORMS was linked successfully."
                       );
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [8])" File: ");
    pMVar2 = tcu::MessageBuilder::operator<<
                       (pMVar2,(char (*) [139])
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                       );
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [8])" Line: ");
    local_1a0[0] = 0x2ae6;
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_1a0);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [15])" Shader code:\n");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&testGeometryShaderStage::geometry_shader_code);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_190);
  }
  return;
}

Assistant:

void testGeometryShaderStage()
	{
		static const char* const fragment_shader_code = "#version 400 core\n"
														"#extension GL_ARB_shader_image_load_store : require\n"
														"\n"
														"precision highp float;\n"
														"\n"
														"void main()\n"
														"{\n"
														"    discard;\n"
														"}\n\n";

		static const char* const geometry_shader_code =
			"#version 400 core\n"
			"#extension GL_ARB_shader_image_load_store : require\n"
			"\n"
			"precision highp float;\n"
			"\n"
			"layout(points)                   in;\n"
			"layout(points, max_vertices = 1) out;\n"
			"\n"
			"#define N_UNIFORMS gl_MaxGeometryImageUniforms + 1\n"
			"\n"
			"in ivec2 vs_gs_coord[];\n"
			"\n"
			"layout(r32i) uniform iimage2D u_image[N_UNIFORMS];\n"
			"\n"
			"void main()\n"
			"{\n"
			"    int value = 1;\n"
			"\n"
			"    for (int i = 0; i < N_UNIFORMS; ++i)\n"
			"    {\n"
			"        value = imageAtomicAdd(u_image[i], vs_gs_coord[0], value);\n"
			"    }\n"
			"}\n\n";

		static const char* const vertex_shader_code = "#version 400 core\n"
													  "#extension GL_ARB_shader_image_load_store : require\n"
													  "\n"
													  "precision highp float;\n"
													  "\n"
													  "in  ivec2 vs_in_coord;\n"
													  "out ivec2 vs_gs_coord;\n"
													  "\n"
													  "void main()\n"
													  "{\n"
													  "    vs_gs_coord = vs_in_coord;\n"
													  "}\n\n";

		m_result_for_geometry_shader =
			!doesProgramLink(fragment_shader_code, geometry_shader_code, 0 /* tesselation_control_shader_code */,
							 0 /* tesselation_evaluation_shader_code */, vertex_shader_code);

		if (false == m_result_for_geometry_shader)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "Program which exceeds limit of GL_MAX_GEOMETRY_IMAGE_UNIFORMS was linked successfully."
				<< " File: " << __FILE__ << " Line: " << __LINE__ << " Shader code:\n"
				<< geometry_shader_code << tcu::TestLog::EndMessage;
		}
	}